

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerProfiledLdFld(Lowerer *this,JitProfilingInstr *ldFldInstr)

{
  LowererMD *pLVar1;
  OpCode OVar2;
  Instr *pIVar3;
  code *pcVar4;
  bool bVar5;
  Opnd *this_00;
  SymOpnd *pSVar6;
  undefined4 *puVar7;
  Opnd *opndArg;
  RegOpnd *pRVar8;
  PropertySymOpnd *pPVar9;
  IntConstOpnd *pIVar10;
  HelperCallOpnd *newSrc;
  JnHelperMethod fnHelper;
  
  pIVar3 = (ldFldInstr->super_Instr).m_prev;
  this_00 = IR::Instr::UnlinkSrc1(&ldFldInstr->super_Instr);
  bVar5 = IR::Opnd::IsSymOpnd(this_00);
  if ((!bVar5) || (pSVar6 = IR::Opnd::AsSymOpnd(this_00), pSVar6->m_sym->m_kind != SymKindProperty))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1637,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as src");
    if (!bVar5) goto LAB_0056746c;
    *puVar7 = 0;
  }
  OVar2 = (ldFldInstr->super_Instr).m_opcode;
  switch(OVar2) {
  case LdFldForTypeOf:
    fnHelper = HelperProfiledLdFldForTypeOf;
    break;
  case ProfiledLdFldForTypeOf:
  case ProfiledLdFldForCallApplyTarget:
  case ProfiledLdRootFld:
  case ProfiledLdMethodFld:
switchD_0056712b_caseD_67:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1695,"(false)","false");
    if (!bVar5) goto LAB_0056746c;
    *puVar7 = 0;
    fnHelper = HelperInvalid;
    goto LAB_00567433;
  case LdFldForCallApplyTarget:
    fnHelper = HelperProfiledLdFld_CallApplyTarget;
    break;
  case LdRootFld:
    fnHelper = HelperProfiledLdRootFld;
    break;
  case LdMethodFld:
    fnHelper = HelperProfiledLdMethodFld;
    break;
  case LdRootMethodFld:
    fnHelper = HelperProfiledLdRootMethodFld;
    break;
  default:
    if (OVar2 == LdFld) {
      fnHelper = HelperProfiledLdFld;
    }
    else {
      if (OVar2 == LdLen_A) {
        if (ldFldInstr->profileId == 0xffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1682,"(ldFldInstr->profileId != Js::Constants::NoProfileId)",
                             "ldFldInstr->profileId != Js::Constants::NoProfileId");
          if (!bVar5) goto LAB_0056746c;
          *puVar7 = 0;
        }
        pLVar1 = &this->m_lowererMD;
        pRVar8 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
        LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pRVar8->super_Opnd);
        pIVar10 = IR::Opnd::CreateProfileIdOpnd(ldFldInstr->profileId,this->m_func);
        LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pIVar10->super_Opnd);
        pPVar9 = IR::Opnd::AsPropertySymOpnd(this_00);
        pIVar10 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar9->m_inlineCacheIndex,this->m_func);
        LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pIVar10->super_Opnd);
        LoadPropertySymAsArgument(this,&ldFldInstr->super_Instr,this_00);
        fnHelper = HelperProfiledLdLen;
        goto LAB_00567433;
      }
      if (OVar2 == LdSuperFld) {
        if (ldFldInstr->profileId != 0xffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1668,"(ldFldInstr->profileId == Js::Constants::NoProfileId)",
                             "ldFldInstr->profileId == Js::Constants::NoProfileId");
          if (!bVar5) goto LAB_0056746c;
          *puVar7 = 0;
        }
        opndArg = IR::Instr::UnlinkSrc2(&ldFldInstr->super_Instr);
        pLVar1 = &this->m_lowererMD;
        LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,opndArg);
        pRVar8 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
        LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pRVar8->super_Opnd);
        pPVar9 = IR::Opnd::AsPropertySymOpnd(this_00);
        pIVar10 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar9->m_inlineCacheIndex,this->m_func);
        LowererMD::LoadHelperArgument(pLVar1,&ldFldInstr->super_Instr,&pIVar10->super_Opnd);
        LoadPropertySymAsArgument(this,&ldFldInstr->super_Instr,this_00);
        fnHelper = HelperProfiledLdSuperFld;
        goto LAB_00567433;
      }
      if (OVar2 != LdRootFldForTypeOf) goto switchD_0056712b_caseD_67;
      fnHelper = HelperProfiledLdRootFldForTypeOf;
    }
  }
  if (ldFldInstr->profileId != 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1654,"(ldFldInstr->profileId == Js::Constants::NoProfileId)",
                       "ldFldInstr->profileId == Js::Constants::NoProfileId");
    if (!bVar5) {
LAB_0056746c:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  pRVar8 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pRVar8->super_Opnd);
  pPVar9 = IR::Opnd::AsPropertySymOpnd(this_00);
  pIVar10 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar9->m_inlineCacheIndex,this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&ldFldInstr->super_Instr,&pIVar10->super_Opnd);
  LoadPropertySymAsArgument(this,&ldFldInstr->super_Instr,this_00);
LAB_00567433:
  newSrc = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  IR::Instr::SetSrc1(&ldFldInstr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,&ldFldInstr->super_Instr,0);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerProfiledLdFld(IR::JitProfilingInstr *ldFldInstr)
{
    const auto instrPrev = ldFldInstr->m_prev;

    auto src = ldFldInstr->UnlinkSrc1();
    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");

    IR::JnHelperMethod helper = IR::HelperInvalid;
    switch (ldFldInstr->m_opcode)
    {
        case Js::OpCode::LdFld:
            helper = IR::HelperProfiledLdFld;
            goto ldFldCommon;
        case Js::OpCode::LdRootFld:
            helper = IR::HelperProfiledLdRootFld;
            goto ldFldCommon;
        case Js::OpCode::LdMethodFld:
            helper = IR::HelperProfiledLdMethodFld;
            goto ldFldCommon;
        case Js::OpCode::LdRootMethodFld:
            helper = IR::HelperProfiledLdRootMethodFld;
            goto ldFldCommon;
        case Js::OpCode::LdFldForCallApplyTarget:
            helper = IR::HelperProfiledLdFld_CallApplyTarget;
            goto ldFldCommon;
        case Js::OpCode::LdFldForTypeOf:
            helper = IR::HelperProfiledLdFldForTypeOf;
            goto ldFldCommon;
        case Js::OpCode::LdRootFldForTypeOf:
            helper = IR::HelperProfiledLdRootFldForTypeOf;
            goto ldFldCommon;

ldFldCommon:
        {
            Assert(ldFldInstr->profileId == Js::Constants::NoProfileId);

            /*
                Var ProfilingHelpers::ProfiledLdFld_Jit(
                    const Var instance,
                    const PropertyId propertyId,
                    const InlineCacheIndex inlineCacheIndex,
                    void *const framePointer)
            */

            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LoadHelperArgument(
                ldFldInstr,
                IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));
            LoadPropertySymAsArgument(ldFldInstr, src);
            break;
        }

        case Js::OpCode::LdSuperFld:
        {
            Assert(ldFldInstr->profileId == Js::Constants::NoProfileId);

            IR::Opnd * src2 = nullptr;

            /*
                Var ProfilingHelpers::ProfiledLdSuperFld_Jit(
                    const Var instance,
                    const PropertyId propertyId,
                    const InlineCacheIndex inlineCacheIndex,
                    void *const framePointer,
                    const Var thisInstance)
            */

            src2 = ldFldInstr->UnlinkSrc2();

            m_lowererMD.LoadHelperArgument(ldFldInstr, src2 );
            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LoadHelperArgument(
                ldFldInstr,
                IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));
            LoadPropertySymAsArgument(ldFldInstr, src);
            helper = IR::HelperProfiledLdSuperFld;
            break;
        }

        case Js::OpCode::LdLen_A:
            Assert(ldFldInstr->profileId != Js::Constants::NoProfileId);

            /*
                Var ProfilingHelpers::ProfiledLdLen_Jit(
                    const Var instance,
                    const PropertyId propertyId,
                    const InlineCacheIndex inlineCacheIndex,
                    const ProfileId profileId,
                    void *const framePointer)
            */

            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateProfileIdOpnd(ldFldInstr->profileId, m_func));
            m_lowererMD.LoadHelperArgument(ldFldInstr, IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));
            LoadPropertySymAsArgument(ldFldInstr, src);
            helper = IR::HelperProfiledLdLen;
            break;

        default:
            Assert(false);
    }

    ldFldInstr->SetSrc1(IR::HelperCallOpnd::New(helper, m_func));
    m_lowererMD.LowerCall(ldFldInstr, 0);

    return instrPrev;
}